

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

TiXmlNode * __thiscall TiXmlDeclaration::Clone(TiXmlDeclaration *this)

{
  TiXmlDeclaration *target;
  
  target = (TiXmlDeclaration *)operator_new(0x68);
  (target->super_TiXmlNode).super_TiXmlBase.location.row = -1;
  (target->super_TiXmlNode).super_TiXmlBase.location.col = -1;
  (target->super_TiXmlNode).super_TiXmlBase.userData = (void *)0x0;
  (target->super_TiXmlNode).parent = (TiXmlNode *)0x0;
  (target->super_TiXmlNode).value.rep_ = &TiXmlString::nullrep_;
  (target->super_TiXmlNode).type = TINYXML_DECLARATION;
  (target->super_TiXmlNode).firstChild = (TiXmlNode *)0x0;
  (target->super_TiXmlNode).lastChild = (TiXmlNode *)0x0;
  (target->super_TiXmlNode).prev = (TiXmlNode *)0x0;
  (target->super_TiXmlNode).next = (TiXmlNode *)0x0;
  (target->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase =
       (_func_int **)&PTR__TiXmlDeclaration_002188c0;
  (target->version).rep_ = &TiXmlString::nullrep_;
  (target->encoding).rep_ = &TiXmlString::nullrep_;
  (target->standalone).rep_ = &TiXmlString::nullrep_;
  CopyTo(this,target);
  return &target->super_TiXmlNode;
}

Assistant:

TiXmlNode* TiXmlDeclaration::Clone() const
{	
	TiXmlDeclaration* clone = new TiXmlDeclaration();

	if ( !clone )
		return 0;

	CopyTo( clone );
	return clone;
}